

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapimpl.cpp
# Opt level: O1

int32_t ubidi_swap(UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  void *__src;
  int32_t iVar1;
  int32_t iVar2;
  void *__dest;
  char *fmt;
  long lVar3;
  bool bVar4;
  int32_t indexes [16];
  int local_78 [18];
  
  iVar1 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((((*(byte *)((long)inData + 0xc) != 0x42) || (*(char *)((long)inData + 0xd) != 'i')) ||
      (*(char *)((long)inData + 0xe) != 'D')) || (*(char *)((long)inData + 0xf) != 'i'))
  goto LAB_001ea1dc;
  if (*(char *)((long)inData + 0x10) != '\x02') {
    if (*(char *)((long)inData + 0x10) != '\x01') {
LAB_001ea1dc:
      udata_printError_63(ds,
                          "ubidi_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as bidi/shaping data\n"
                          ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd)
                          ,(ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf)
                          ,(uint)*(byte *)((long)inData + 0x10));
      *pErrorCode = U_UNSUPPORTED_ERROR;
      return 0;
    }
    if (*(char *)((long)inData + 0x12) == '\x05') {
      bVar4 = *(char *)((long)inData + 0x13) == '\x02';
    }
    else {
      bVar4 = false;
    }
    if (!bVar4) goto LAB_001ea1dc;
  }
  if ((-1 < length) && (length = length - iVar1, length < 0x40)) {
    fmt = "ubidi_swap(): too few bytes (%d after header) for bidi/shaping data\n";
LAB_001ea2a3:
    udata_printError_63(ds,fmt,(ulong)(uint)length);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0;
  }
  __src = (void *)((long)inData + (long)iVar1);
  __dest = (void *)((long)iVar1 + (long)outData);
  lVar3 = 0;
  do {
    iVar2 = udata_readInt32_63(ds,*(int32_t *)((long)__src + lVar3 * 4));
    local_78[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  if (-1 < length) {
    if (length < local_78[1]) {
      fmt = "ubidi_swap(): too few bytes (%d after header) for all of bidi/shaping data\n";
      goto LAB_001ea2a3;
    }
    if (inData != outData) {
      memcpy(__dest,__src,(long)local_78[1]);
    }
    (*ds->swapArray32)(ds,__src,local_78[0] * 4,__dest,pErrorCode);
    utrie_swapAnyVersion_63
              (ds,(void *)((long)__src + (long)local_78[0] * 4),local_78[2],
               (void *)((long)__dest + (long)local_78[0] * 4),pErrorCode);
    lVar3 = (long)(local_78[2] + local_78[0] * 4);
    (*ds->swapArray32)(ds,(void *)((long)__src + lVar3),local_78[3] << 2,
                       (void *)((long)__dest + lVar3),pErrorCode);
  }
  return local_78[1] + iVar1;
}

Assistant:

static int32_t U_CALLCONV
ubidi_swap(const UDataSwapper *ds,
           const void *inData, int32_t length, void *outData,
           UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const int32_t *inIndexes;
    int32_t indexes[16];

    int32_t i, offset, count, size;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==UBIDI_FMT_0 &&    /* dataFormat="BiDi" */
        pInfo->dataFormat[1]==UBIDI_FMT_1 &&
        pInfo->dataFormat[2]==UBIDI_FMT_2 &&
        pInfo->dataFormat[3]==UBIDI_FMT_3 &&
        ((pInfo->formatVersion[0]==1 &&
          pInfo->formatVersion[2]==UTRIE_SHIFT &&
          pInfo->formatVersion[3]==UTRIE_INDEX_SHIFT) ||
         pInfo->formatVersion[0]==2)
    )) {
        udata_printError(ds, "ubidi_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as bidi/shaping data\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inIndexes=(const int32_t *)inBytes;

    if(length>=0) {
        length-=headerSize;
        if(length<16*4) {
            udata_printError(ds, "ubidi_swap(): too few bytes (%d after header) for bidi/shaping data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    /* read the first 16 indexes (ICU 3.4/format version 1: UBIDI_IX_TOP==16, might grow) */
    for(i=0; i<16; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }

    /* get the total length of the data */
    size=indexes[UBIDI_IX_LENGTH];

    if(length>=0) {
        if(length<size) {
            udata_printError(ds, "ubidi_swap(): too few bytes (%d after header) for all of bidi/shaping data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, size);
        }

        offset=0;

        /* swap the int32_t indexes[] */
        count=indexes[UBIDI_IX_INDEX_TOP]*4;
        ds->swapArray32(ds, inBytes, count, outBytes, pErrorCode);
        offset+=count;

        /* swap the UTrie */
        count=indexes[UBIDI_IX_TRIE_SIZE];
        utrie_swapAnyVersion(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the uint32_t mirrors[] */
        count=indexes[UBIDI_IX_MIRROR_LENGTH]*4;
        ds->swapArray32(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* just skip the uint8_t jgArray[] and jgArray2[] */
        count=indexes[UBIDI_IX_JG_LIMIT]-indexes[UBIDI_IX_JG_START];
        offset+=count;
        count=indexes[UBIDI_IX_JG_LIMIT2]-indexes[UBIDI_IX_JG_START2];
        offset+=count;

        U_ASSERT(offset==size);
    }

    return headerSize+size;
}